

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data_collection.cpp
# Opt level: O1

void duckdb::ColumnDataCopyStruct
               (ColumnDataMetaData *meta_data,UnifiedVectorFormat *source_data,Vector *source,
               idx_t offset,idx_t copy_count)

{
  ColumnDataCollectionSegment *pCVar1;
  column_data_copy_function_t p_Var2;
  child_list_t<LogicalType> *pcVar3;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true> *this;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  pointer this_00;
  type pVVar8;
  size_type __n;
  UnifiedVectorFormat child_data;
  ColumnDataMetaData local_a8;
  UnifiedVectorFormat local_78;
  
  pCVar1 = meta_data->segment;
  TemplatedColumnDataCopy<duckdb::StructValueCopy>(meta_data,source_data,source,offset,copy_count);
  pcVar3 = StructType::GetChildTypes_abi_cxx11_(&source->type);
  this = StructVector::GetEntries(source);
  if ((pcVar3->
      super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (pcVar3->
      super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      pvVar4 = vector<duckdb::ColumnDataCopyFunction,_true>::operator[]
                         (&meta_data->copy_function->child_functions,__n);
      pvVar5 = vector<duckdb::VectorMetaData,_true>::operator[]
                         (&meta_data->segment->vector_data,(meta_data->vector_data_index).index);
      pvVar6 = vector<duckdb::VectorDataIndex,_true>::operator[]
                         (&pCVar1->child_indices,(pvVar5->child_index).index + __n);
      local_a8.vector_data_index.index = pvVar6->index;
      local_a8.segment = meta_data->segment;
      local_a8.state = meta_data->state;
      local_a8.chunk_data = meta_data->chunk_data;
      local_a8.child_list_size = 0xffffffffffffffff;
      local_a8.copy_function = pvVar4;
      UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
      pvVar7 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
               ::operator[](this,__n);
      this_00 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator->
                          (pvVar7);
      Vector::ToUnifiedFormat(this_00,copy_count,&local_78);
      p_Var2 = pvVar4->function;
      pvVar7 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
               ::operator[](this,__n);
      pVVar8 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                         (pvVar7);
      (*p_Var2)(&local_a8,&local_78,pVVar8,offset,copy_count);
      if (local_78.owned_sel.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_78.owned_sel.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      __n = __n + 1;
    } while (__n < (ulong)(((long)(pcVar3->
                                  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                  ).
                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(pcVar3->
                                  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                  ).
                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                          0x6db6db6db6db6db7));
  }
  return;
}

Assistant:

void ColumnDataCopyStruct(ColumnDataMetaData &meta_data, const UnifiedVectorFormat &source_data, Vector &source,
                          idx_t offset, idx_t copy_count) {
	auto &segment = meta_data.segment;

	// copy the NULL values for the main struct vector
	TemplatedColumnDataCopy<StructValueCopy>(meta_data, source_data, source, offset, copy_count);

	auto &child_types = StructType::GetChildTypes(source.GetType());
	// now copy all the child vectors
	D_ASSERT(meta_data.GetVectorMetaData().child_index.IsValid());
	auto &child_vectors = StructVector::GetEntries(source);
	for (idx_t child_idx = 0; child_idx < child_types.size(); child_idx++) {
		auto &child_function = meta_data.copy_function.child_functions[child_idx];
		auto child_index = segment.GetChildIndex(meta_data.GetVectorMetaData().child_index, child_idx);
		ColumnDataMetaData child_meta_data(child_function, meta_data, child_index);

		UnifiedVectorFormat child_data;
		child_vectors[child_idx]->ToUnifiedFormat(copy_count, child_data);

		child_function.function(child_meta_data, child_data, *child_vectors[child_idx], offset, copy_count);
	}
}